

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSet.cpp
# Opt level: O2

int __thiscall HSet::remove(HSet *this,char *__filename)

{
  bool bVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  int iVar5;
  undefined8 unaff_RBP;
  
  bVar1 = this->setup_;
  if (bVar1 == false) {
    setup(this,1,0,false,(FILE *)0x0,false,true);
    if (this->debug_ == false) {
      return 0;
    }
  }
  else {
    if ((int)__filename < 0) {
      return 0;
    }
    if (this->max_entry_ < (int)__filename) {
      return 0;
    }
    piVar3 = (this->pointer_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = piVar3[(ulong)__filename & 0xffffffff];
    if ((long)iVar2 == -1) {
      return 0;
    }
    piVar3[(ulong)__filename & 0xffffffff] = -1;
    iVar5 = this->count_ + -1;
    if (iVar2 < iVar5) {
      piVar4 = (this->entry_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar5 = piVar4[(long)this->count_ + -1];
      piVar4[iVar2] = iVar5;
      piVar3[iVar5] = iVar2;
      iVar5 = this->count_ + -1;
    }
    this->count_ = iVar5;
    if (this->debug_ != true) {
      return 1;
    }
  }
  debug(this);
  return (int)CONCAT71((int7)((ulong)unaff_RBP >> 8),bVar1);
}

Assistant:

bool HSet::remove(const HighsInt entry) {
  if (!setup_) {
    setup(1, 0);
    if (debug_) debug();
    return false;
  }
  if (entry < min_entry) return false;
  if (entry > max_entry_) return false;
  HighsInt pointer = pointer_[entry];
  if (pointer == no_pointer) return false;
  pointer_[entry] = no_pointer;
  if (pointer < count_ - 1) {
    HighsInt last_entry = entry_[count_ - 1];
    entry_[pointer] = last_entry;
    pointer_[last_entry] = pointer;
  }
  count_--;
  if (debug_) debug();
  return true;
}